

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_read_pre_tree(lzx_stream *strm)

{
  byte bVar1;
  lzx_dec *plVar2;
  wchar_t wVar3;
  wchar_t local_2c;
  wchar_t i;
  lzx_br *br;
  lzx_dec *ds;
  lzx_stream *strm_local;
  
  plVar2 = strm->ds;
  if (plVar2->loop == L'\0') {
    memset((plVar2->pt).freq,0,0x44);
  }
  local_2c = plVar2->loop;
  while( true ) {
    if ((plVar2->pt).len_size <= local_2c) {
      plVar2->loop = local_2c;
      return L'\x01';
    }
    if ((((plVar2->br).cache_avail < L'\x04') &&
        (wVar3 = lzx_br_fillup(strm,&plVar2->br), wVar3 == L'\0')) &&
       ((plVar2->br).cache_avail < L'\x04')) break;
    (plVar2->pt).bitlen[local_2c] =
         (byte)((plVar2->br).cache_buffer >> ((char)(plVar2->br).cache_avail - 4U & 0x3f)) & 0xf;
    bVar1 = (plVar2->pt).bitlen[local_2c];
    (plVar2->pt).freq[bVar1] = (plVar2->pt).freq[bVar1] + L'\x01';
    (plVar2->br).cache_avail = (plVar2->br).cache_avail + L'\xfffffffc';
    local_2c = local_2c + L'\x01';
  }
  plVar2->loop = local_2c;
  return L'\0';
}

Assistant:

static int
lzx_read_pre_tree(struct lzx_stream *strm)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br *br = &(ds->br);
	int i;

	if (ds->loop == 0)
		memset(ds->pt.freq, 0, sizeof(ds->pt.freq));
	for (i = ds->loop; i < ds->pt.len_size; i++) {
		if (!lzx_br_read_ahead(strm, br, 4)) {
			ds->loop = i;
			return (0);
		}
		ds->pt.bitlen[i] = lzx_br_bits(br, 4);
		ds->pt.freq[ds->pt.bitlen[i]]++;
		lzx_br_consume(br, 4);
	}
	ds->loop = i;
	return (1);
}